

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateAnimMesh.cpp
# Opt level: O1

aiAnimMesh * Assimp::aiCreateAnimMesh(aiMesh *mesh)

{
  char *pcVar1;
  uint uVar2;
  aiVector3D *paVar3;
  void *pvVar4;
  aiAnimMesh *paVar5;
  aiVector3D *paVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  ulong __n;
  
  paVar5 = (aiAnimMesh *)operator_new(0x4b0);
  (paVar5->mName).length = 0;
  (paVar5->mName).data[0] = '\0';
  memset((paVar5->mName).data + 1,0x1b,0x3ff);
  memset(&paVar5->mVertices,0,0xa8);
  uVar2 = mesh->mNumVertices;
  paVar5->mNumVertices = uVar2;
  paVar3 = mesh->mVertices;
  uVar8 = (ulong)uVar2;
  if (paVar3 != (aiVector3D *)0x0) {
    paVar6 = (aiVector3D *)operator_new__(uVar8 * 0xc);
    if (uVar2 != 0) {
      memset(paVar6,0,((uVar8 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar5->mVertices = paVar6;
    memcpy(paVar6,paVar3,uVar8 * 0xc);
  }
  paVar3 = mesh->mNormals;
  if (paVar3 != (aiVector3D *)0x0) {
    paVar6 = (aiVector3D *)operator_new__(uVar8 * 0xc);
    if (uVar2 != 0) {
      memset(paVar6,0,((uVar8 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar5->mNormals = paVar6;
    memcpy(paVar6,paVar3,uVar8 * 0xc);
  }
  paVar3 = mesh->mTangents;
  if (paVar3 != (aiVector3D *)0x0) {
    paVar6 = (aiVector3D *)operator_new__(uVar8 * 0xc);
    if (uVar2 != 0) {
      memset(paVar6,0,((uVar8 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar5->mTangents = paVar6;
    memcpy(paVar6,paVar3,uVar8 * 0xc);
  }
  paVar3 = mesh->mBitangents;
  if (paVar3 != (aiVector3D *)0x0) {
    paVar6 = (aiVector3D *)operator_new__(uVar8 * 0xc);
    if (uVar2 != 0) {
      memset(paVar6,0,((uVar8 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar5->mBitangents = paVar6;
    memcpy(paVar6,paVar3,uVar8 * 0xc);
  }
  lVar9 = 0x85;
  do {
    pvVar4 = *(void **)((long)mesh + lVar9 * 8 + -0x3f8);
    if (pvVar4 == (void *)0x0) {
      pcVar1 = (paVar5->mName).data + lVar9 * 8 + -4;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    else {
      uVar2 = paVar5->mNumVertices;
      __n = (ulong)uVar2 << 4;
      pvVar7 = operator_new__(__n);
      if ((ulong)uVar2 != 0) {
        memset(pvVar7,0,__n);
      }
      *(void **)((paVar5->mName).data + lVar9 * 8 + -4) = pvVar7;
      memcpy(pvVar7,pvVar4,uVar8 << 4);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x8d);
  lVar9 = 0x8d;
  do {
    pvVar4 = *(void **)((long)mesh + lVar9 * 8 + -0x3f8);
    if (pvVar4 == (void *)0x0) {
      pcVar1 = (paVar5->mName).data + lVar9 * 8 + -4;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
    else {
      uVar2 = paVar5->mNumVertices;
      pvVar7 = operator_new__((ulong)uVar2 * 0xc);
      if (uVar2 != 0) {
        memset(pvVar7,0,(((ulong)uVar2 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      *(void **)((paVar5->mName).data + lVar9 * 8 + -4) = pvVar7;
      memcpy(pvVar7,pvVar4,uVar8 * 0xc);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x95);
  return paVar5;
}

Assistant:

aiAnimMesh *aiCreateAnimMesh(const aiMesh *mesh)
{
    aiAnimMesh *animesh = new aiAnimMesh;
    animesh->mNumVertices = mesh->mNumVertices;
    if (mesh->mVertices) {
        animesh->mVertices = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mVertices, mesh->mVertices, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mNormals) {
        animesh->mNormals = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mNormals, mesh->mNormals, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mTangents) {
        animesh->mTangents = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mTangents, mesh->mTangents, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mBitangents) {
        animesh->mBitangents = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mBitangents, mesh->mBitangents, mesh->mNumVertices * sizeof(aiVector3D));
    }

    for (int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
        if (mesh->mColors[i]) {
            animesh->mColors[i] = new aiColor4D[animesh->mNumVertices];
            std::memcpy(animesh->mColors[i], mesh->mColors[i], mesh->mNumVertices * sizeof(aiColor4D));
        } else {
            animesh->mColors[i] = NULL;
        }
    }

    for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
        if (mesh->mTextureCoords[i]) {
            animesh->mTextureCoords[i] = new aiVector3D[animesh->mNumVertices];
            std::memcpy(animesh->mTextureCoords[i], mesh->mTextureCoords[i], mesh->mNumVertices * sizeof(aiVector3D));
        } else {
            animesh->mTextureCoords[i] = NULL;
        }
    }
    return animesh;
}